

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printf.h
# Opt level: O0

type __thiscall
fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>::
operator()(printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>
           *this,bool value)

{
  byte bVar1;
  format_specs *pfVar2;
  undefined1 in_CL;
  undefined7 in_register_00000009;
  void *__buf;
  byte in_SIL;
  arg_formatter_base<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_> *in_RDI;
  format_specs *fmt_spec;
  undefined7 in_stack_ffffffffffffffe8;
  basic_buffer<char> *local_8;
  
  bVar1 = in_SIL & 1;
  pfVar2 = internal::
           arg_formatter_base<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>::
           spec(in_RDI);
  if ((pfVar2->super_core_format_specs).type == 's') {
    (pfVar2->super_core_format_specs).type = '\0';
    internal::
    arg_formatter_base<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>::write
              (in_RDI,(uint)((bVar1 & 1) != 0),__buf,CONCAT71(in_register_00000009,in_CL));
    local_8 = (basic_buffer<char> *)
              internal::
              arg_formatter_base<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>
              ::out(in_RDI);
  }
  else {
    local_8 = (basic_buffer<char> *)
              internal::
              arg_formatter_base<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>
              ::operator()((arg_formatter_base<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>
                            *)CONCAT17(bVar1,in_stack_ffffffffffffffe8),(int)((ulong)pfVar2 >> 0x20)
                          );
  }
  return (type)local_8;
}

Assistant:

typename std::enable_if<std::is_integral<T>::value, iterator>::type
      operator()(T value) {
    // MSVC2013 fails to compile separate overloads for bool and char_type so
    // use std::is_same instead.
    if (std::is_same<T, bool>::value) {
      format_specs &fmt_spec = *this->spec();
      if (fmt_spec.type != 's')
        return base::operator()(value ? 1 : 0);
      fmt_spec.type = 0;
      this->write(value != 0);
    } else if (std::is_same<T, char_type>::value) {
      format_specs &fmt_spec = *this->spec();
      if (fmt_spec.type && fmt_spec.type != 'c')
        return (*this)(static_cast<int>(value));
      fmt_spec.flags = 0;
      fmt_spec.align_ = ALIGN_RIGHT;
      return base::operator()(value);
    } else {
      return base::operator()(value);
    }
    return this->out();
  }